

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::initialiseLpColCost(HEkk *this)

{
  double dVar1;
  int iVar2;
  reference pvVar3;
  long in_RDI;
  double dVar4;
  HighsInt iCol;
  double cost_scale_factor;
  undefined4 local_14;
  
  dVar4 = pow(2.0,(double)*(int *)(*(long *)(in_RDI + 8) + 0x218));
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x2198); local_14 = local_14 + 1) {
    iVar2 = *(int *)(in_RDI + 0x2288);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x21a0),(long)local_14)
    ;
    dVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2560),(long)local_14)
    ;
    *pvVar3 = (double)iVar2 * dVar4 * dVar1;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2590),(long)local_14)
    ;
    *pvVar3 = 0.0;
  }
  return;
}

Assistant:

void HEkk::initialiseLpColCost() {
  double cost_scale_factor = pow(2.0, options_->cost_scale_factor);
  for (HighsInt iCol = 0; iCol < lp_.num_col_; iCol++) {
    info_.workCost_[iCol] =
        (HighsInt)lp_.sense_ * cost_scale_factor * lp_.col_cost_[iCol];
    info_.workShift_[iCol] = 0;
  }
}